

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::AddPsbtDataRequest,cfd::js::api::json::PsbtOutputData,cfd::js::api::AddPsbtDataRequestStruct,cfd::js::api::PsbtOutputDataStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::AddPsbtDataRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  PsbtOutputDataStruct response;
  PsbtOutputData res;
  AddPsbtDataRequestStruct request;
  AddPsbtDataRequest req;
  string local_2f8;
  PsbtOutputDataStruct local_2d8;
  ErrorResponse local_1f0;
  AddPsbtDataRequestStruct local_138;
  AddPsbtDataRequest local_b8;
  
  AddPsbtDataRequest::AddPsbtDataRequest(&local_b8);
  core::JsonClassBase<cfd::js::api::json::AddPsbtDataRequest>::Deserialize
            (&local_b8.super_JsonClassBase<cfd::js::api::json::AddPsbtDataRequest>,(string *)this);
  AddPsbtDataRequest::ConvertToStruct(&local_138,&local_b8);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_2d8,request_message,&local_138);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_2d8.error.code == 0) {
      PsbtOutputData::PsbtOutputData((PsbtOutputData *)&local_1f0);
      PsbtOutputData::ConvertFromStruct((PsbtOutputData *)&local_1f0,&local_2d8);
      core::JsonClassBase<cfd::js::api::json::PsbtOutputData>::Serialize_abi_cxx11_
                (&local_2f8,(JsonClassBase<cfd::js::api::json::PsbtOutputData> *)&local_1f0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p);
      }
      PsbtOutputData::~PsbtOutputData((PsbtOutputData *)&local_1f0);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_1f0,&local_2d8.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_2f8,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_1f0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p);
      }
      local_1f0.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a78a38;
      InnerErrorResponse::~InnerErrorResponse(&local_1f0.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1f0.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2d8.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2d8.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.error.message._M_dataplus._M_p != &local_2d8.error.message.field_2) {
      operator_delete(local_2d8.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.error.type._M_dataplus._M_p != &local_2d8.error.type.field_2) {
      operator_delete(local_2d8.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.hex._M_dataplus._M_p != &local_2d8.hex.field_2) {
      operator_delete(local_2d8.hex._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.psbt._M_dataplus._M_p != &local_2d8.psbt.field_2) {
      operator_delete(local_2d8.psbt._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_138.ignore_items._M_t);
    std::
    vector<cfd::js::api::PsbtAddOutputRequestStruct,_std::allocator<cfd::js::api::PsbtAddOutputRequestStruct>_>
    ::~vector(&local_138.outputs);
    std::
    vector<cfd::js::api::PsbtAddInputRequestStruct,_std::allocator<cfd::js::api::PsbtAddInputRequestStruct>_>
    ::~vector(&local_138.inputs);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.psbt._M_dataplus._M_p != &local_138.psbt.field_2) {
      operator_delete(local_138.psbt._M_dataplus._M_p);
    }
    AddPsbtDataRequest::~AddPsbtDataRequest(&local_b8);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  PsbtOutputData::~PsbtOutputData((PsbtOutputData *)&local_1f0);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  PsbtOutputDataStruct::~PsbtOutputDataStruct(&local_2d8);
  AddPsbtDataRequestStruct::~AddPsbtDataRequestStruct(&local_138);
  AddPsbtDataRequest::~AddPsbtDataRequest(&local_b8);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}